

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzpermutation.cpp
# Opt level: O0

void __thiscall TPZPermutation::TPZPermutation(TPZPermutation *this,int n)

{
  int *piVar1;
  int in_ESI;
  TPZSavable *in_RDI;
  int i;
  TPZSavable *copy;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int iVar2;
  int iVar3;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  TPZSavable::TPZSavable(in_RDI,&PTR_PTR_023d2b90);
  in_RDI->_vptr_TPZSavable = (_func_int **)&PTR__TPZPermutation_023d2b40;
  copy = in_RDI + 1;
  TPZManVector<int,_10>::TPZManVector
            ((TPZManVector<int,_10> *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),(int *)copy);
  TPZManVector<int,_10>::TPZManVector
            ((TPZManVector<int,_10> *)CONCAT44(in_stack_ffffffffffffffe4,0xffffffff),
             CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),(int *)copy);
  iVar2 = 0;
  while (iVar2 < in_ESI) {
    iVar3 = iVar2;
    piVar1 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 10),(long)iVar2);
    *piVar1 = iVar2;
    iVar2 = iVar3 + 1;
  }
  return;
}

Assistant:

TPZPermutation::TPZPermutation(int n) : fCounter(n,0), fOrder(n,-1)
{
	int i;
	for(i=0; i<n; i++) fOrder[i] = i;
}